

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_function.hpp
# Opt level: O2

object boost::python::detail::
       make_function_aux<std::__cxx11::string(HighFreqDataType::*)()const,boost::python::default_call_policies,boost::mpl::vector2<std::__cxx11::string,HighFreqDataType&>>
                 (first_type f,default_call_policies *p,
                 vector2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HighFreqDataType_&>
                 *param_3)

{
  pointer *__ptr;
  py_function local_28;
  undefined1 local_20 [16];
  
  local_20._0_8_ = p;
  local_20._8_8_ = param_3;
  objects::py_function::
  py_function<boost::python::detail::caller<std::__cxx11::string(HighFreqDataType::*)()const,boost::python::default_call_policies,boost::mpl::vector2<std::__cxx11::string,HighFreqDataType&>>>
            (&local_28,
             (caller<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(HighFreqDataType::*)()_const,_boost::python::default_call_policies,_boost::mpl::vector2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HighFreqDataType_&>_>
              *)local_20);
  objects::function_object((objects *)f,&local_28);
  if (local_28.m_impl._M_t.
      super___uniq_ptr_impl<boost::python::objects::py_function_impl_base,_std::default_delete<boost::python::objects::py_function_impl_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_boost::python::objects::py_function_impl_base_*,_std::default_delete<boost::python::objects::py_function_impl_base>_>
      .super__Head_base<0UL,_boost::python::objects::py_function_impl_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<boost::python::objects::py_function_impl_base,_std::default_delete<boost::python::objects::py_function_impl_base>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_28.m_impl._M_t.
                          super___uniq_ptr_impl<boost::python::objects::py_function_impl_base,_std::default_delete<boost::python::objects::py_function_impl_base>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_boost::python::objects::py_function_impl_base_*,_std::default_delete<boost::python::objects::py_function_impl_base>_>
                          .
                          super__Head_base<0UL,_boost::python::objects::py_function_impl_base_*,_false>
                          ._M_head_impl + 8))();
  }
  return (object)(object_base)f;
}

Assistant:

object make_function_aux(
      F f                               // An object that can be invoked by detail::invoke()
      , CallPolicies const& p           // CallPolicies to use in the invocation
      , Sig const&                      // An MPL sequence of argument types expected by F
      )
  {
      return objects::function_object(
          detail::caller<F,CallPolicies,Sig>(f, p)
      );
  }